

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O3

bool __thiscall Clasp::SatElite::bceVe(SatElite *this,Var v,uint32 maxCnt)

{
  OccurList *pOVar1;
  undefined1 *puVar2;
  uint uVar3;
  Clause *c2;
  pointer puVar4;
  pointer ppCVar5;
  Var ev;
  Literal *pLVar6;
  ClauseList *this_00;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint *puVar11;
  uint uVar12;
  ulong uVar13;
  uint *puVar14;
  uint uVar15;
  Literal *pLVar16;
  size_type sVar17;
  bool freeId;
  ClRange CVar18;
  Clause *lhs;
  Clause *rhs;
  Clause *local_80;
  uint32 local_78;
  Var local_74;
  ulong local_70;
  uint local_64;
  Literal *local_60;
  uint *local_58;
  Clause *local_50;
  ulong local_48;
  Literal *local_40;
  ClauseList *local_38;
  
  local_48 = (ulong)v;
  if ((((*(((this->super_SatPreprocessor).ctx_)->solvers_).ebo_.buf)->assign_).assign_.ebo_.buf
       [local_48] & 3) != 0) {
    return true;
  }
  (this->resCands_).ebo_.size = 0;
  uVar10 = *(uint *)(this->super_SatPreprocessor).opts_ & 3;
  CVar18 = splitOcc(this,v,uVar10 == 3);
  if (this->occT_[0].ebo_.size == 0) {
    uVar15 = 0;
  }
  else {
    local_38 = &this->resCands_;
    sVar17 = this->occT_[1].ebo_.size;
    local_70 = 0;
    if (uVar10 != 3) {
      sVar17 = 0;
    }
    puVar14 = this->occT_[0].ebo_.buf;
    local_64 = (uint)(uVar10 >= 2) << 0x1f;
    uVar15 = 0;
    local_78 = maxCnt;
    local_74 = v;
    do {
      local_80 = (this->super_SatPreprocessor).clauses_.ebo_.buf[*puVar14];
      uVar8 = *(uint *)&local_80->field_0x8;
      if ((uVar8 & 0x3fffffff) != 0) {
        uVar9 = 0;
        do {
          uVar3 = local_80->lits_[uVar9].rep_;
          uVar12 = uVar3 >> 2;
          uVar13 = 0x4000000000000000;
          if ((uVar3 & 2) != 0) {
            uVar13 = 0x8000000000000000;
          }
          *(ulong *)&this->occurs_[uVar12].field_0x18 =
               *(ulong *)&this->occurs_[uVar12].field_0x18 & 0x3fffffffffffffff | uVar13;
          uVar9 = uVar9 + 1;
        } while (((ulong)uVar8 & 0x3fffffff) != uVar9);
        uVar8 = *(uint *)&local_80->field_0x8;
      }
      uVar8 = uVar8 & 0x7fffffff | local_64;
      *(uint *)&local_80->field_0x8 = uVar8;
      if (this->occT_[1].ebo_.size == 0) {
        bVar7 = false;
      }
      else {
        puVar11 = this->occT_[1].ebo_.buf;
        local_58 = puVar14;
        do {
          local_60 = CVar18.second;
          local_40 = CVar18.first;
          c2 = (this->super_SatPreprocessor).clauses_.ebo_.buf[*puVar11];
          local_50 = c2;
          bVar7 = trivialResolvent(this,c2,local_74);
          this_00 = local_38;
          if (!bVar7) {
            sVar17 = sVar17 + ((int)*(uint *)&c2->field_0x8 >> 0x1f);
            *(uint *)&c2->field_0x8 = *(uint *)&c2->field_0x8 & 0x7fffffff;
            uVar8 = *(uint *)&local_80->field_0x8 & 0x7fffffff;
            *(uint *)&local_80->field_0x8 = uVar8;
            uVar15 = uVar15 + 1;
            if (local_78 < uVar15) {
              if (sVar17 == 0) {
                sVar17 = 0;
                bVar7 = uVar10 < 2;
                goto LAB_00190fb8;
              }
            }
            else {
              bk_lib::
              pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
              ::push_back(local_38,&local_80);
              bk_lib::
              pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
              ::push_back(this_00,&local_50);
            }
          }
          CVar18.second = local_60;
          CVar18.first = local_40;
          puVar11 = puVar11 + 1;
        } while (puVar11 != this->occT_[1].ebo_.buf + this->occT_[1].ebo_.size);
        uVar8 = *(uint *)&local_80->field_0x8;
        bVar7 = false;
LAB_00190fb8:
        CVar18.second = local_60;
        CVar18.first = local_40;
        puVar14 = local_58;
      }
      ev = local_74;
      if ((uVar8 & 0x3fffffff) != 0) {
        uVar9 = 0;
        do {
          puVar2 = &this->occurs_[local_80->lits_[uVar9].rep_ >> 2].field_0x18;
          *(ulong *)puVar2 = *(ulong *)puVar2 & 0x3fffffffffffffff;
          uVar9 = uVar9 + 1;
        } while ((uVar8 & 0x3fffffff) != uVar9);
        uVar8 = *(uint *)&local_80->field_0x8;
      }
      puVar4 = this->occT_[0].ebo_.buf;
      if ((int)uVar8 < 0) {
        uVar9 = local_70 & 0xffffffff;
        local_70 = (ulong)((int)local_70 + 1);
        puVar4[uVar9] = *puVar14;
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar4 + this->occT_[0].ebo_.size && !bVar7);
    v = local_74;
    if (local_78 < uVar15) {
      if ((int)local_70 + sVar17 != 0) {
        if ((int)local_70 != 0) {
          uVar13 = local_70 & 0xffffffff;
          uVar9 = 0;
          do {
            local_60 = CVar18.second;
            local_40 = CVar18.first;
            bceVeRemove(this,this->occT_[0].ebo_.buf[uVar9],false,ev,true);
            CVar18.second = local_60;
            CVar18.first = local_40;
            uVar9 = uVar9 + 1;
          } while (uVar13 != uVar9);
        }
        if (sVar17 != 0) {
          puVar14 = this->occT_[1].ebo_.buf;
          do {
            local_60 = CVar18.second;
            local_40 = CVar18.first;
            local_50 = (this->super_SatPreprocessor).clauses_.ebo_.buf[*puVar14];
            if (*(int *)&local_50->field_0x8 < 0) {
              bceVeRemove(this,*puVar14,false,ev,true);
              CVar18.second = local_60;
              CVar18.first = local_40;
              sVar17 = sVar17 - 1;
            }
            puVar14 = puVar14 + 1;
          } while (sVar17 != 0);
        }
      }
      goto LAB_001911a3;
    }
  }
  local_60 = CVar18.second;
  local_40 = CVar18.first;
  SharedContext::eliminate((this->super_SatPreprocessor).ctx_,v);
  pLVar6 = local_40;
  pLVar16 = local_40;
  if (local_40 != local_60) {
    do {
      uVar10 = pLVar16->rep_ >> 2;
      if ((this->super_SatPreprocessor).clauses_.ebo_.buf[uVar10] != (Clause *)0x0) {
        freeId = uVar15 != 0;
        bVar7 = uVar15 == 0;
        uVar15 = uVar15 - 1;
        if (bVar7) {
          uVar15 = 0;
        }
        bceVeRemove(this,uVar10,freeId,v,false);
      }
      pLVar16 = pLVar16 + 1;
    } while (pLVar16 != local_60);
  }
  if ((this->resCands_).ebo_.size != 0) {
    uVar9 = 0;
    do {
      ppCVar5 = (this->resCands_).ebo_.buf;
      bVar7 = addResolvent(this,*(uint *)((long)&pLVar6->rep_ + uVar9 * 2) >> 2,
                           ppCVar5[uVar9 & 0xffffffff],ppCVar5[(int)uVar9 + 1]);
      if (!bVar7) {
        return false;
      }
      uVar9 = uVar9 + 2;
    } while ((size_type)uVar9 != (this->resCands_).ebo_.size);
  }
  pOVar1 = this->occurs_ + local_48;
  if (*(int *)&this->occurs_[local_48].refs.super_type.
               super_left_right_rep<Clasp::Literal,_unsigned_int>.field_0x8 < 0) {
    operator_delete((pOVar1->refs).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.
                    buf_);
  }
  CVar18.second = local_60;
  CVar18.first = local_40;
  (pOVar1->refs).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.buf_ =
       (buf_type *)0x0;
  *(undefined8 *)
   &(pOVar1->refs).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.field_0x8 = 0;
  (pOVar1->refs).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.right_ = 0;
  *(undefined8 *)&pOVar1->field_0x18 = 0;
LAB_001911a3:
  local_60 = CVar18.second;
  local_40 = CVar18.first;
  bVar7 = true;
  if (((ulong)*(this->super_SatPreprocessor).opts_ & 0x1ffc) == 0) {
    bVar7 = backwardSubsume(this);
  }
  return bVar7;
}

Assistant:

bool SatElite::bceVe(Var v, uint32 maxCnt) {
	Solver* s = ctx_->master();
	if (s->value(v) != value_free) return true;
	assert(!ctx_->varInfo(v).frozen() && !ctx_->eliminated(v));
	resCands_.clear();
	// distribute clauses on v
	// check if number of clauses decreases if we'd eliminate v
	uint32 bce     = opts_->bce();
	ClRange cls    = splitOcc(v, bce > 1);
	uint32 cnt     = 0;
	uint32 markMax = ((uint32)occT_[neg].size() * (bce>1));
	uint32 blocked = 0;
	bool stop      = false;
	Clause* lhs, *rhs;
	for (VarVec::const_iterator i = occT_[pos].begin(); i != occT_[pos].end() && !stop; ++i) {
		lhs         = clause(*i);
		markAll(&(*lhs)[0], lhs->size());
		lhs->setMarked(bce != 0);
		for (VarVec::const_iterator j = occT_[neg].begin(); j != occT_[neg].end(); ++j) {
			if (!trivialResolvent(*(rhs = clause(*j)), v)) {
				markMax -= rhs->marked();
				rhs->setMarked(false); // not blocked on v
				lhs->setMarked(false); // not blocked on v
				if (++cnt <= maxCnt) {
					resCands_.push_back(lhs);
					resCands_.push_back(rhs);
				}
				else if (!markMax) {
					stop = (bce == 0);
					break;
				}
			}
		}
		unmarkAll(&(*lhs)[0], lhs->size());
		if (lhs->marked()) {
			occT_[pos][blocked++] = *i;
		}
	}
	if (cnt <= maxCnt) {
		// eliminate v by clause distribution
		ctx_->eliminate(v);  // mark var as eliminated
		// remove old clauses, store them in the elimination table so that
		// (partial) models can be extended.
		for (ClIter it = cls.first; it != cls.second; ++it) {
			// reuse first cnt ids for resolvents
			if (clause(it->var())) {
				bool freeId = (cnt && cnt--);
				bceVeRemove(it->var(), freeId, v, false);
			}
		}
		// add non trivial resolvents
		assert( resCands_.size() % 2 == 0 );
		ClIter it = cls.first;
		for (VarVec::size_type i = 0; i != resCands_.size(); i+=2, ++it) {
			if (!addResolvent(it->var(), *resCands_[i], *resCands_[i+1])) {
				return false;
			}
		}
		assert(occurs_[v].numOcc() == 0);
		// release memory
		occurs_[v].clear();
	}
	else if ( (blocked + markMax) > 0 ) {
		// remove blocked clauses
		for (uint32 i = 0; i != blocked; ++i) {
			bceVeRemove(occT_[pos][i], false, v, true);
		}
		for (VarVec::const_iterator it = occT_[neg].begin(); markMax; ++it) {
			if ( (rhs = clause(*it))->marked() ) {
				bceVeRemove(*it, false, v, true);
				--markMax;
			}
		}
	}
	return opts_->limIters != 0 || backwardSubsume();
}